

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong mkvparser::UnserializeUInt(IMkvReader *pReader,longlong pos,longlong size)

{
  int iVar1;
  long status;
  long lStack_38;
  uchar b;
  longlong i;
  longlong result;
  longlong size_local;
  longlong pos_local;
  IMkvReader *pReader_local;
  
  if ((((pReader == (IMkvReader *)0x0) || (pos < 0)) || (size < 1)) || (8 < size)) {
    pReader_local = (IMkvReader *)0xfffffffffffffffe;
  }
  else {
    i = 0;
    result = size;
    size_local = pos;
    pos_local = (longlong)pReader;
    for (lStack_38 = 0; lStack_38 < result; lStack_38 = lStack_38 + 1) {
      iVar1 = (*(code *)**(undefined8 **)pos_local)(pos_local,size_local,1,(long)&status + 7);
      if ((long)iVar1 < 0) {
        return (long)iVar1;
      }
      i = (ulong)status._7_1_ | i << 8;
      size_local = size_local + 1;
    }
    pReader_local = (IMkvReader *)i;
  }
  return (longlong)pReader_local;
}

Assistant:

long long UnserializeUInt(IMkvReader* pReader, long long pos, long long size) {
  if (!pReader || pos < 0 || (size <= 0) || (size > 8))
    return E_FILE_FORMAT_INVALID;

  long long result = 0;

  for (long long i = 0; i < size; ++i) {
    unsigned char b;

    const long status = pReader->Read(pos, 1, &b);

    if (status < 0)
      return status;

    result <<= 8;
    result |= b;

    ++pos;
  }

  return result;
}